

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O1

void __thiscall Assimp::FBX::LayeredTexture::fillTexture(LayeredTexture *this,Document *doc)

{
  pointer *pppTVar1;
  iterator __position;
  Object *pOVar2;
  ulong uVar3;
  Texture *tex;
  undefined1 local_68 [32];
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_48
  ;
  
  Document::GetConnectionsByDestinationSequenced(&local_48,doc,(this->super_Object).id);
  if (local_48.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      pOVar2 = Connection::SourceObject
                         (local_48.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar3]);
      if (pOVar2 == (Object *)0x0) {
        local_68._0_8_ = (Texture *)(local_68 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,"failed to read source object for texture link, ignoring","");
        Util::DOMWarning((string *)local_68,(this->super_Object).element);
        if ((Texture *)local_68._0_8_ != (Texture *)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        }
      }
      else {
        local_68._0_8_ = __dynamic_cast(pOVar2,&Object::typeinfo,&Texture::typeinfo,0);
        __position._M_current =
             (this->textures).
             super__Vector_base<const_Assimp::FBX::Texture_*,_std::allocator<const_Assimp::FBX::Texture_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->textures).
            super__Vector_base<const_Assimp::FBX::Texture_*,_std::allocator<const_Assimp::FBX::Texture_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::FBX::Texture_const*,std::allocator<Assimp::FBX::Texture_const*>>::
          _M_realloc_insert<Assimp::FBX::Texture_const*const&>
                    ((vector<Assimp::FBX::Texture_const*,std::allocator<Assimp::FBX::Texture_const*>>
                      *)&this->textures,__position,(Texture **)local_68);
        }
        else {
          *__position._M_current = (Texture *)local_68._0_8_;
          pppTVar1 = &(this->textures).
                      super__Vector_base<const_Assimp::FBX::Texture_*,_std::allocator<const_Assimp::FBX::Texture_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)local_48.
                                   super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_48.
                                   super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_48.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LayeredTexture::fillTexture(const Document& doc)
{
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID());
    for(size_t i = 0; i < conns.size();++i)
    {
        const Connection* con = conns.at(i);

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for texture link, ignoring",&element);
            continue;
        }

        const Texture* const tex = dynamic_cast<const Texture*>(ob);

        textures.push_back(tex);
    }
}